

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.hpp
# Opt level: O0

void __thiscall m2d::savanna::ssl_reuse::request::request(request *this)

{
  int local_1c;
  duration<long,_std::ratio<1L,_1L>_> local_18;
  request *local_10;
  request *this_local;
  
  this->_vptr_request = (_func_int **)&PTR__request_0039bd30;
  this->follow_location = false;
  local_10 = this;
  std::shared_ptr<m2d::savanna::endpoint>::shared_ptr(&this->endpoint);
  this->version = 0xb;
  std::__cxx11::string::string((string *)&this->body);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->header_fields);
  local_1c = 0x1e;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_18,&local_1c);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&this->timeout_interval,&local_18);
  return;
}

Assistant:

request() { }